

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::Table_Equality2_Test::~Table_Equality2_Test(Table_Equality2_Test *this)

{
  Table_Equality2_Test *this_local;
  
  ~Table_Equality2_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Table, Equality2) {
  StringTable t;
  std::vector<std::pair<std::string, std::string>> v1 = {{"a", "b"},
                                                         {"aa", "bb"}};
  t.insert(std::begin(v1), std::end(v1));
  StringTable u;
  std::vector<std::pair<std::string, std::string>> v2 = {{"a", "a"},
                                                         {"aa", "aa"}};
  u.insert(std::begin(v2), std::end(v2));
  EXPECT_NE(u, t);
}